

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

bool icu_63::number::impl::blueprint_helpers::parseExponentSignOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *param_3)

{
  int32_t sLength;
  UStringTrieResult UVar1;
  StemEnum stem;
  UNumberSignDisplay exponentSignDisplay;
  char16_t *p;
  Notation NVar2;
  UNumberSignDisplay sign;
  ConstChar16Ptr local_68;
  UStringTrieResult local_60;
  UStringTrieResult result;
  ConstChar16Ptr local_50;
  undefined1 local_48 [8];
  UCharsTrie tempStemTrie;
  UErrorCode *param_2_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  tempStemTrie._24_8_ = param_3;
  ConstChar16Ptr::ConstChar16Ptr(&local_50,::(anonymous_namespace)::kSerializedStemTrie);
  UCharsTrie::UCharsTrie((UCharsTrie *)local_48,&local_50);
  ConstChar16Ptr::~ConstChar16Ptr(&local_50);
  numparse::impl::StringSegment::toTempUnicodeString((UnicodeString *)&sign,segment);
  p = UnicodeString::getBuffer((UnicodeString *)&sign);
  ConstChar16Ptr::ConstChar16Ptr(&local_68,p);
  sLength = numparse::impl::StringSegment::length(segment);
  UVar1 = UCharsTrie::next((UCharsTrie *)local_48,&local_68,sLength);
  ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  UnicodeString::~UnicodeString((UnicodeString *)&sign);
  local_60 = UVar1;
  if ((UVar1 == USTRINGTRIE_INTERMEDIATE_VALUE) || (UVar1 == USTRINGTRIE_FINAL_VALUE)) {
    stem = UCharsTrie::getValue((UCharsTrie *)local_48);
    exponentSignDisplay = stem_to_object::signDisplay(stem);
    if (exponentSignDisplay == UNUM_SIGN_COUNT) {
      segment_local._7_1_ = false;
    }
    else {
      NVar2 = (Notation)
              ScientificNotation::withExponentSignDisplay
                        ((ScientificNotation *)&macros->notation,exponentSignDisplay);
      macros->notation = NVar2;
      segment_local._7_1_ = true;
    }
  }
  else {
    segment_local._7_1_ = false;
  }
  UCharsTrie::~UCharsTrie((UCharsTrie *)local_48);
  return segment_local._7_1_;
}

Assistant:

bool
blueprint_helpers::parseExponentSignOption(const StringSegment& segment, MacroProps& macros, UErrorCode&) {
    // Get the sign display type out of the CharsTrie data structure.
    UCharsTrie tempStemTrie(kSerializedStemTrie);
    UStringTrieResult result = tempStemTrie.next(
            segment.toTempUnicodeString().getBuffer(),
            segment.length());
    if (result != USTRINGTRIE_INTERMEDIATE_VALUE && result != USTRINGTRIE_FINAL_VALUE) {
        return false;
    }
    auto sign = stem_to_object::signDisplay(static_cast<StemEnum>(tempStemTrie.getValue()));
    if (sign == UNUM_SIGN_COUNT) {
        return false;
    }
    macros.notation = static_cast<ScientificNotation&>(macros.notation).withExponentSignDisplay(sign);
    return true;
}